

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)3>_>::~ParticleTest_GetSetFactor_Test
          (ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  void *in_RDI;
  
  ~ParticleTest_GetSetFactor_Test
            ((ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)3>_> *)0x205ef8);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetFactor) 
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle = this->randomParticle();
    FactorType newFactor = 6523.54;
    particle.setFactor(newFactor);
    ASSERT_EQ(newFactor, particle.getFactor());
}